

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

SIMDReplace * __thiscall
wasm::Builder::makeSIMDReplace
          (Builder *this,SIMDReplaceOp op,Expression *vec,uint8_t index,Expression *value)

{
  SIMDReplace *pSVar1;
  SIMDReplace *ret;
  Expression *value_local;
  uint8_t index_local;
  Expression *vec_local;
  SIMDReplaceOp op_local;
  Builder *this_local;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDReplace>(&this->wasm->allocator);
  pSVar1->op = op;
  pSVar1->vec = vec;
  pSVar1->index = index;
  pSVar1->value = value;
  wasm::SIMDReplace::finalize();
  return pSVar1;
}

Assistant:

SIMDReplace* makeSIMDReplace(SIMDReplaceOp op,
                               Expression* vec,
                               uint8_t index,
                               Expression* value) {
    auto* ret = wasm.allocator.alloc<SIMDReplace>();
    ret->op = op;
    ret->vec = vec;
    ret->index = index;
    ret->value = value;
    ret->finalize();
    return ret;
  }